

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

char parseNibble(char hex)

{
  byte bVar1;
  
  bVar1 = (hex & 0xdfU) - 0x37;
  if ((hex & 0x40U) == 0) {
    bVar1 = hex & 0xf;
  }
  return bVar1;
}

Assistant:

char parseNibble(char hex) {
	hex &= ~0x20;
	if (hex & 0x40) {
		hex -= 'A' - 10;
	}
	else {
		hex &= 0xf;
	}
	return hex;
}